

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

int32_t ures_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                    UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  uint32_t res;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  uint uVar6;
  uint uVar7;
  Resource *inBundle_00;
  undefined8 in_stack_fffffffffffff2b8;
  undefined4 uVar8;
  int32_t local_d28;
  int32_t resFlagsLength;
  uint32_t stackResFlags [200];
  Resource *outBundle;
  int32_t top;
  int32_t resBottom;
  int32_t keysTop;
  int32_t keysBottom;
  int32_t indexLength;
  int32_t bundleLength;
  int32_t *inIndexes;
  TempTable tempTable;
  int32_t resort [200];
  Row rows [200];
  int32_t maxTableLength;
  int32_t headerSize;
  Resource rootRes;
  Resource *inBundle;
  UDataInfo *pInfo;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffff2b8 >> 0x20);
  iVar2 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if (((((*(char *)((long)inData + 0xc) == 'R') && (*(char *)((long)inData + 0xd) == 'e')) &&
            (*(char *)((long)inData + 0xe) == 's')) && (*(char *)((long)inData + 0xf) == 'B')) &&
          (((*(char *)((long)inData + 0x10) == '\x01' && (*(char *)((long)inData + 0x11) != '\0'))
           || ((*(char *)((long)inData + 0x10) == '\x02' ||
               (*(char *)((long)inData + 0x10) == '\x03')))))) {
    tempTable.resFlags._4_1_ = *(byte *)((long)inData + 0x10);
    if (length < 0) {
      keysBottom = -1;
    }
    else {
      keysBottom = (length - iVar2) / 4;
      if (keysBottom < 6) {
        udata_printError_63(ds,
                            "ures_swap(): too few bytes (%d after header) for a resource bundle\n",
                            (ulong)(uint)(length - iVar2));
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
      }
    }
    inBundle_00 = (Resource *)((long)inData + (long)iVar2);
    res = (*ds->readUInt32)(*inBundle_00);
    uVar3 = udata_readInt32_63(ds,inBundle_00[1]);
    uVar3 = uVar3 & 0xff;
    if (uVar3 < 5) {
      udata_printError_63(ds,"ures_swap(): too few indexes for a 1.1+ resource bundle\n");
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      ds_local._4_4_ = 0;
    }
    else {
      iVar4 = uVar3 + 1;
      iVar5 = udata_readInt32_63(ds,inBundle_00[2]);
      outBundle._4_4_ = iVar5;
      if (6 < uVar3) {
        outBundle._4_4_ = udata_readInt32_63(ds,inBundle_00[7]);
      }
      uVar6 = udata_readInt32_63(ds,inBundle_00[4]);
      uVar7 = udata_readInt32_63(ds,inBundle_00[5]);
      if ((keysBottom < 0) || ((int)uVar6 <= keysBottom)) {
        if ((int)(uVar3 + 1) < iVar5) {
          tempTable.resFlags._0_4_ = iVar5 << 2;
        }
        else {
          tempTable.resFlags._0_4_ = 0;
        }
        if (-1 < length) {
          stackResFlags._792_8_ = (long)outData + (long)iVar2;
          uVar3 = (length + 0x1f >> 5) + 3U & 0xfffffffc;
          if ((int)uVar3 < 0x321) {
            tempTable.resort = &local_d28;
          }
          else {
            tempTable.resort = (int32_t *)uprv_malloc_63((long)(int)uVar3);
            if (tempTable.resort == (int32_t *)0x0) {
              udata_printError_63(ds,
                                  "ures_swap(): unable to allocate memory for tracking resources\n")
              ;
              *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
              return 0;
            }
          }
          memset(tempTable.resort,0,(long)(int)uVar3);
          if (inData != outData) {
            memcpy((void *)stackResFlags._792_8_,inBundle_00,(long)(int)(uVar6 << 2));
          }
          udata_swapInvStringBlock_63
                    (ds,inBundle_00 + iVar4,(iVar5 - iVar4) * 4,
                     (void *)(stackResFlags._792_8_ + (long)iVar4 * 4),pErrorCode);
          UVar1 = U_FAILURE(*pErrorCode);
          if (UVar1 != '\0') {
            udata_printError_63(ds,"ures_swap().udata_swapInvStringBlock(keys[%d]) failed\n",
                                (ulong)(uint)((iVar5 - iVar4) * 4));
            return 0;
          }
          if (iVar5 < outBundle._4_4_) {
            (*ds->swapArray16)(ds,inBundle_00 + iVar5,(outBundle._4_4_ - iVar5) * 4,
                               (void *)(stackResFlags._792_8_ + (long)iVar5 * 4),pErrorCode);
            UVar1 = U_FAILURE(*pErrorCode);
            if (UVar1 != '\0') {
              udata_printError_63(ds,"ures_swap().swapArray16(16-bit units[%d]) failed\n",
                                  (ulong)(uint)((outBundle._4_4_ - iVar5) * 2));
              return 0;
            }
          }
          inIndexes = (int32_t *)stackResFlags._792_8_;
          if ((tempTable.resFlags._4_1_ < 2) && (200 < (int)uVar7)) {
            tempTable.keyChars =
                 (char *)uprv_malloc_63((long)(int)uVar7 * 8 + (long)(int)(uVar7 << 2));
            if (tempTable.keyChars == (char *)0x0) {
              udata_printError_63(ds,
                                  "ures_swap(): unable to allocate memory for sorting tables (max length: %d)\n"
                                  ,(ulong)uVar7);
              *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
              if (tempTable.resort != &local_d28) {
                uprv_free_63(tempTable.resort);
              }
              return 0;
            }
            tempTable.rows = (Row *)(tempTable.keyChars + (long)(int)uVar7 * 8);
          }
          else {
            tempTable.keyChars = (char *)(resort + 0xc6);
            tempTable.rows = (Row *)&tempTable.localKeyLimit;
          }
          ures_swapResource(ds,inBundle_00,(Resource *)stackResFlags._792_8_,res,(char *)0x0,
                            (TempTable *)&inIndexes,pErrorCode);
          UVar1 = U_FAILURE(*pErrorCode);
          if (UVar1 != '\0') {
            udata_printError_63(ds,"ures_swapResource(root res=%08x) failed\n",(ulong)res);
          }
          if ((int32_t *)tempTable.keyChars != resort + 0xc6) {
            uprv_free_63(tempTable.keyChars);
          }
          if (tempTable.resort != &local_d28) {
            uprv_free_63(tempTable.resort);
          }
          (*ds->swapArray32)(ds,inBundle_00,iVar4 * 4,(void *)stackResFlags._792_8_,pErrorCode);
        }
        ds_local._4_4_ = iVar2 + uVar6 * 4;
      }
      else {
        udata_printError_63(ds,"ures_swap(): resource top %d exceeds bundle length %d\n",
                            (ulong)uVar6,(ulong)(uint)keysBottom);
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        ds_local._4_4_ = 0;
      }
    }
  }
  else {
    udata_printError_63(ds,
                        "ures_swap(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not a resource bundle\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)*(byte *)((long)inData + 0xd),
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        CONCAT44(uVar8,(uint)*(byte *)((long)inData + 0x10)),
                        (uint)*(byte *)((long)inData + 0x11));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    ds_local._4_4_ = 0;
  }
  return ds_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ures_swap(const UDataSwapper *ds,
          const void *inData, int32_t length, void *outData,
          UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    const Resource *inBundle;
    Resource rootRes;
    int32_t headerSize, maxTableLength;

    Row rows[STACK_ROW_CAPACITY];
    int32_t resort[STACK_ROW_CAPACITY];
    TempTable tempTable;

    const int32_t *inIndexes;

    /* the following integers count Resource item offsets (4 bytes each), not bytes */
    int32_t bundleLength, indexLength, keysBottom, keysTop, resBottom, top;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x52 &&   /* dataFormat="ResB" */
        pInfo->dataFormat[1]==0x65 &&
        pInfo->dataFormat[2]==0x73 &&
        pInfo->dataFormat[3]==0x42 &&
        /* formatVersion 1.1+ or 2.x or 3.x */
        ((pInfo->formatVersion[0]==1 && pInfo->formatVersion[1]>=1) ||
            pInfo->formatVersion[0]==2 || pInfo->formatVersion[0]==3)
    )) {
        udata_printError(ds, "ures_swap(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not a resource bundle\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0], pInfo->formatVersion[1]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }
    tempTable.majorFormatVersion=pInfo->formatVersion[0];

    /* a resource bundle must contain at least one resource item */
    if(length<0) {
        bundleLength=-1;
    } else {
        bundleLength=(length-headerSize)/4;

        /* formatVersion 1.1 must have a root item and at least 5 indexes */
        if(bundleLength<(1+5)) {
            udata_printError(ds, "ures_swap(): too few bytes (%d after header) for a resource bundle\n",
                             length-headerSize);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    inBundle=(const Resource *)((const char *)inData+headerSize);
    rootRes=ds->readUInt32(*inBundle);

    /* formatVersion 1.1 adds the indexes[] array */
    inIndexes=(const int32_t *)(inBundle+1);

    indexLength=udata_readInt32(ds, inIndexes[URES_INDEX_LENGTH])&0xff;
    if(indexLength<=URES_INDEX_MAX_TABLE_LENGTH) {
        udata_printError(ds, "ures_swap(): too few indexes for a 1.1+ resource bundle\n");
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    keysBottom=1+indexLength;
    keysTop=udata_readInt32(ds, inIndexes[URES_INDEX_KEYS_TOP]);
    if(indexLength>URES_INDEX_16BIT_TOP) {
        resBottom=udata_readInt32(ds, inIndexes[URES_INDEX_16BIT_TOP]);
    } else {
        resBottom=keysTop;
    }
    top=udata_readInt32(ds, inIndexes[URES_INDEX_BUNDLE_TOP]);
    maxTableLength=udata_readInt32(ds, inIndexes[URES_INDEX_MAX_TABLE_LENGTH]);

    if(0<=bundleLength && bundleLength<top) {
        udata_printError(ds, "ures_swap(): resource top %d exceeds bundle length %d\n",
                         top, bundleLength);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    if(keysTop>(1+indexLength)) {
        tempTable.localKeyLimit=keysTop<<2;
    } else {
        tempTable.localKeyLimit=0;
    }

    if(length>=0) {
        Resource *outBundle=(Resource *)((char *)outData+headerSize);

        /* track which resources we have already swapped */
        uint32_t stackResFlags[STACK_ROW_CAPACITY];
        int32_t resFlagsLength;

        /*
         * We need one bit per 4 resource bundle bytes so that we can track
         * every possible Resource for whether we have swapped it already.
         * Multiple Resource words can refer to the same bundle offsets
         * for sharing identical values.
         * We could optimize this by allocating only for locations above
         * where Resource values are stored (above keys & strings).
         */
        resFlagsLength=(length+31)>>5;          /* number of bytes needed */
        resFlagsLength=(resFlagsLength+3)&~3;   /* multiple of 4 bytes for uint32_t */
        if(resFlagsLength<=(int32_t)sizeof(stackResFlags)) {
            tempTable.resFlags=stackResFlags;
        } else {
            tempTable.resFlags=(uint32_t *)uprv_malloc(resFlagsLength);
            if(tempTable.resFlags==NULL) {
                udata_printError(ds, "ures_swap(): unable to allocate memory for tracking resources\n");
                *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
                return 0;
            }
        }
        uprv_memset(tempTable.resFlags, 0, resFlagsLength);

        /* copy the bundle for binary and inaccessible data */
        if(inData!=outData) {
            uprv_memcpy(outBundle, inBundle, 4*top);
        }

        /* swap the key strings, but not the padding bytes (0xaa) after the last string and its NUL */
        udata_swapInvStringBlock(ds, inBundle+keysBottom, 4*(keysTop-keysBottom),
                                    outBundle+keysBottom, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "ures_swap().udata_swapInvStringBlock(keys[%d]) failed\n", 4*(keysTop-keysBottom));
            return 0;
        }

        /* swap the 16-bit units (strings, table16, array16) */
        if(keysTop<resBottom) {
            ds->swapArray16(ds, inBundle+keysTop, (resBottom-keysTop)*4, outBundle+keysTop, pErrorCode);
            if(U_FAILURE(*pErrorCode)) {
                udata_printError(ds, "ures_swap().swapArray16(16-bit units[%d]) failed\n", 2*(resBottom-keysTop));
                return 0;
            }
        }

        /* allocate the temporary table for sorting resource tables */
        tempTable.keyChars=(const char *)outBundle; /* sort by outCharset */
        if(tempTable.majorFormatVersion>1 || maxTableLength<=STACK_ROW_CAPACITY) {
            tempTable.rows=rows;
            tempTable.resort=resort;
        } else {
            tempTable.rows=(Row *)uprv_malloc(maxTableLength*sizeof(Row)+maxTableLength*4);
            if(tempTable.rows==NULL) {
                udata_printError(ds, "ures_swap(): unable to allocate memory for sorting tables (max length: %d)\n",
                                 maxTableLength);
                *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
                if(tempTable.resFlags!=stackResFlags) {
                    uprv_free(tempTable.resFlags);
                }
                return 0;
            }
            tempTable.resort=(int32_t *)(tempTable.rows+maxTableLength);
        }

        /* swap the resources */
        ures_swapResource(ds, inBundle, outBundle, rootRes, NULL, &tempTable, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "ures_swapResource(root res=%08x) failed\n",
                             rootRes);
        }

        if(tempTable.rows!=rows) {
            uprv_free(tempTable.rows);
        }
        if(tempTable.resFlags!=stackResFlags) {
            uprv_free(tempTable.resFlags);
        }

        /* swap the root resource and indexes */
        ds->swapArray32(ds, inBundle, keysBottom*4, outBundle, pErrorCode);
    }

    return headerSize+4*top;
}